

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O2

void cf_poly1305_finish(cf_poly1305 *ctx,uint8_t *out)

{
  size_t sVar1;
  long lVar2;
  size_t sVar3;
  uint32_t *puVar4;
  uint32_t c [17];
  uint32_t s [17];
  uint32_t local_b8 [20];
  uint32_t local_68 [16];
  undefined4 local_28;
  
  sVar1 = ctx->npartial;
  if (sVar1 != 0) {
    local_b8[0xc] = 0;
    local_b8[0xd] = 0;
    local_b8[0xe] = 0;
    local_b8[0xf] = 0;
    local_b8[8] = 0;
    local_b8[9] = 0;
    local_b8[10] = 0;
    local_b8[0xb] = 0;
    local_b8[4] = 0;
    local_b8[5] = 0;
    local_b8[6] = 0;
    local_b8[7] = 0;
    local_b8[0] = 0;
    local_b8[1] = 0;
    local_b8[2] = 0;
    local_b8[3] = 0;
    local_b8[0x10] = 0;
    for (sVar3 = 0; sVar1 != sVar3; sVar3 = sVar3 + 1) {
      local_b8[sVar3] = (uint)ctx->partial[sVar3];
    }
    local_b8[sVar1] = 1;
    poly1305_block(ctx,local_b8);
  }
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    local_68[lVar2] = (uint)ctx->s[lVar2];
  }
  local_28 = 0;
  for (lVar2 = 0; lVar2 != 0x11; lVar2 = lVar2 + 1) {
    local_b8[lVar2] = ctx->h[lVar2];
  }
  poly1305_add(local_b8,negative_1305);
  for (lVar2 = 0; lVar2 != 0x11; lVar2 = lVar2 + 1) {
    puVar4 = local_b8 + lVar2;
    if ((char)local_b8[0x10] < '\0') {
      puVar4 = ctx->h + lVar2;
    }
    ctx->h[lVar2] = *puVar4;
  }
  poly1305_add(ctx->h,local_68);
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    out[lVar2] = (uint8_t)ctx->h[lVar2];
  }
  memset(ctx,0,0xb0);
  return;
}

Assistant:

void cf_poly1305_finish(cf_poly1305 *ctx,
                        uint8_t out[16])
{
  if (ctx->npartial)
    poly1305_last_block(ctx);

  uint32_t s[17];
  size_t i;
  for (i = 0; i < 16; i++)
    s[i] = ctx->s[i];
  s[16] = 0;

  poly1305_full_reduce(ctx->h);
  poly1305_add(ctx->h, s);

  for (i = 0; i < 16; i++)
    out[i] = ctx->h[i];

  mem_clean(ctx, sizeof *ctx);
}